

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O0

string * __thiscall
StringType::GenStringSize_abi_cxx11_(StringType *this,Output *out_cc,Env *env,DataPtr *data)

{
  uint uVar1;
  StringType *in_RCX;
  undefined8 in_RDX;
  Env *in_RSI;
  ID *in_RDI;
  undefined8 in_R8;
  int static_size;
  ID *id;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  id = in_RDI;
  uVar1 = (*(code *)in_RSI->parent[2].context_object_)(in_RSI,in_RCX);
  if ((int)uVar1 < 0) {
    (**(code **)&in_RSI->parent[2].allow_undefined_id_)(in_RSI,in_RDX,in_RCX,in_R8);
    string_length_var(in_RCX);
    Env::RValue(in_RSI,id);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd3);
  }
  else {
    strfmt_abi_cxx11_((char *)in_RDI,"%d",(ulong)uVar1);
  }
  return (string *)id;
}

Assistant:

string StringType::GenStringSize(Output* out_cc, Env* env, const DataPtr& data)
	{
	int static_size = StaticSize(env);
	if ( static_size >= 0 )
		return strfmt("%d", static_size);
	GenDynamicSize(out_cc, env, data);
	return env->RValue(string_length_var());
	}